

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

error assemble_half_float_immediate
                (context *ctx,token *token,opcode *op,int bits,int offset,int neg_bit)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 in_register_0000000c;
  ulong *puVar9;
  uint in_stack_00000008;
  token local_58;
  
  puVar9 = (ulong *)CONCAT44(in_register_0000000c,bits);
  uVar1 = op[1].reuse;
  switch(uVar1) {
  case 1:
  case 6:
  case 7:
    if (uVar1 != 1) {
      context::tokenize(&local_58,(context *)token);
      *(int *)&op[2].value = local_58.column;
      op[1].value = (uint64_t)local_58.data.string._M_str;
      op[1].reuse = local_58.type;
      op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
      op->value = (uint64_t)local_58.filename;
      op->reuse = local_58.data.predicate.index;
      op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    }
    iVar6 = equal((token *)op,"QNAN");
    uVar7 = 0x7fff;
    if (iVar6 == 0) {
      iVar6 = equal((token *)op,"INF");
      uVar7 = 0x7c00;
      if (iVar6 == 0) goto switchD_0012f0a8_caseD_2;
    }
    if (uVar1 == 7) {
      if (-1 < (int)in_stack_00000008) {
        uVar8 = *puVar9;
        uVar4 = uVar8 >> ((ulong)in_stack_00000008 & 0x3f);
        goto joined_r0x0012f1c2;
      }
      uVar7 = uVar7 | 0x8000;
    }
    break;
  default:
switchD_0012f0a8_caseD_2:
    fail((token *)ctx,(char *)op,"expected floating-point literal, QNAN, or INF");
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  case 4:
    lVar2._0_4_ = op->reuse;
    lVar2._4_4_ = op->sched;
    uVar5 = fp32_to_fp16<(std::float_round_style)1>((float)lVar2);
    uVar7 = (uint)uVar5;
    if ((-1 < (int)in_stack_00000008) &&
       (lVar3._0_4_ = op->reuse, lVar3._4_4_ = op->sched, lVar3 < 0)) {
LAB_0012f1b2:
      uVar8 = *puVar9;
      uVar4 = uVar8 >> ((ulong)in_stack_00000008 & 0x3f);
joined_r0x0012f1c2:
      if ((uVar4 & 1) != 0) goto LAB_0012f258;
      *puVar9 = uVar8 | 1L << ((byte)in_stack_00000008 & 0x3f);
    }
    break;
  case 5:
    uVar5 = fp32_to_fp16<(std::float_round_style)1>((float)*(double *)&op->reuse);
    uVar7 = (uint)uVar5;
    if ((-1 < (int)in_stack_00000008) &&
       (*(double *)&op->reuse <= 0.0 && *(double *)&op->reuse != 0.0)) goto LAB_0012f1b2;
  }
  if (offset != 0x10) {
    if (offset != 9) {
      __assert_fail("false && \"invalid bits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/helper.cpp"
                    ,300,
                    "error assemble_half_float_immediate(context &, token &, opcode &, int, int, int)"
                   );
    }
    uVar7 = uVar7 >> 6 & 0x1ff;
  }
  uVar8 = (ulong)uVar7 << ((byte)neg_bit & 0x3f);
  if ((*puVar9 & uVar8) == 0) {
    *puVar9 = *puVar9 | uVar8;
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    ctx->pc = 0;
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  }
LAB_0012f258:
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

error assemble_half_float_immediate(context& ctx, token& token, opcode& op, int bits, int offset,
                                    int neg_bit)
{
    static constexpr char MESSAGE[] = "expected floating-point literal, QNAN, or INF";

    uint16_t value;
    switch (token.type) {
    case token_type::float_immediate:
        value = fp32_to_fp16(token.data.float_immediate);
        if (token.data.float_immediate < 0 && neg_bit >= 0) {
            op.add_bits(1ULL << neg_bit);
        }
        break;
    case token_type::immediate:
        value = fp32_to_fp16(static_cast<float>(token.data.immediate));
        if (token.data.immediate < 0 && neg_bit >= 0) {
            op.add_bits(1ULL << neg_bit);
        }
        break;
    case token_type::plus:
    case token_type::minus:
    case token_type::identifier: {
        const bool negate = token.type == token_type::minus;
        if (token.type != token_type::identifier) {
            token = ctx.tokenize();
        }
        if (equal(token, "QNAN")) {
            value = 0x7fff;
        } else if (equal(token, "INF")) {
            value = 0x7c00;
        } else {
            return fail(token, MESSAGE);
        }
        if (negate) {
            if (neg_bit >= 0) {
                op.add_bits(1ULL << neg_bit);
            } else {
                value |= 0x8000;
            }
        }
        break;
    }
    default:
        return fail(token, MESSAGE);
    }
    if (bits == 9) {
        // TODO: add a setting to warn/error precision losses
        op.add_bits(static_cast<uint64_t>(static_cast<uint16_t>(value << 1) >> 7) << offset);
    } else if (bits == 16) {
        op.add_bits(static_cast<uint64_t>(value) << offset);
    } else {
        assert(false && "invalid bits");
    }
    token = ctx.tokenize();
    return {};
}